

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

bool __thiscall indk::Event::doWaitTimed(Event *this,int T)

{
  bool bVar1;
  cv_status cVar2;
  bool bVar3;
  unique_lock<std::mutex> oNotifierLock;
  milliseconds rTimeout;
  unique_lock<std::mutex> local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  local_30.__r = (rep)T;
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->m_oMutex);
  bVar3 = false;
  while ((bVar1 = this->m_bEvent, !bVar3 && (bVar1 == false))) {
    cVar2 = std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                      (&this->m_oConditionVariable,&local_40,&local_30);
    bVar3 = cVar2 == timeout;
  }
  this->m_bEvent = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return bVar1;
}

Assistant:

bool indk::Event::doWaitTimed(int T) {
    auto rTimeout = std::chrono::milliseconds(T);
    bool bTimeout = false;
    bool bRet;
    std::unique_lock<std::mutex> oNotifierLock(m_oMutex);
    while (!m_bEvent && !bTimeout) {
        bTimeout = std::cv_status::timeout == m_oConditionVariable.wait_for(oNotifierLock, rTimeout);
    }
    bRet = m_bEvent;
    m_bEvent = false;
    return bRet;
}